

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep.c
# Opt level: O0

int splittingStep_WriteParameters(ARKodeMem ark_mem,FILE *fp)

{
  ARKodeMem in_RSI;
  int retval;
  ARKodeSplittingStepMem step_mem;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  long lVar1;
  int local_4;
  
  lVar1 = 0;
  local_4 = splittingStep_AccessStepMem
                      (in_RSI,(char *)0x0,
                       (ARKodeSplittingStepMem *)
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (local_4 == 0) {
    fprintf((FILE *)in_RSI,"SplittingStep time step module parameters:\n  Method order %i\n\n",
            (ulong)*(uint *)(lVar1 + 0x1c));
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int splittingStep_WriteParameters(ARKodeMem ark_mem, FILE* fp)
{
  ARKodeSplittingStepMem step_mem = NULL;
  int retval = splittingStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  fprintf(fp, "SplittingStep time step module parameters:\n  Method order %i\n\n",
          step_mem->order);

  return ARK_SUCCESS;
}